

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-alloc.c
# Opt level: O1

hash_node * ggml_gallocr_hash_get(ggml_gallocr_t galloc,ggml_tensor *t)

{
  uint uVar1;
  ulong uVar2;
  ggml_bitset_t *pgVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar2 = (galloc->hash_set).size;
  pgVar3 = (galloc->hash_set).used;
  uVar5 = ((ulong)t >> 4) % uVar2;
  uVar4 = uVar5;
  while( true ) {
    uVar1 = pgVar3[uVar4 >> 5];
    if ((uVar1 >> ((uint)uVar4 & 0x1f) & 1) == 0) break;
    if ((galloc->hash_set).keys[uVar4] == t) goto LAB_001244c9;
    uVar4 = uVar4 + 1;
    if (uVar4 == uVar2) {
      uVar4 = 0;
    }
    if (uVar4 == uVar5) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-impl.h"
                 ,0x11a,"fatal error");
    }
  }
  pgVar3[uVar4 >> 5] = 1 << ((byte)uVar4 & 0x1f) | uVar1;
  (galloc->hash_set).keys[uVar4] = t;
LAB_001244c9:
  return galloc->hash_values + uVar4;
}

Assistant:

static struct hash_node * ggml_gallocr_hash_get(ggml_gallocr_t galloc, struct ggml_tensor * t) {
    size_t i = ggml_hash_find_or_insert(&galloc->hash_set, t);
    return &galloc->hash_values[i];
}